

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void pnga_shift_diagonal(Integer g_a,void *c)

{
  int iVar1;
  int iVar2;
  _iterator_hdl hdl;
  int local_sync_end;
  int local_sync_begin;
  Integer num_blocks_a;
  char *ptr;
  Integer nproc;
  Integer i;
  Integer me;
  Integer atype;
  Integer type;
  Integer adims [2];
  Integer andim;
  Integer ld;
  Integer hiA [2];
  Integer loA [2];
  Integer *in_stack_fffffffffffffc98;
  char **in_stack_fffffffffffffca0;
  Integer *in_stack_fffffffffffffca8;
  Integer *in_stack_fffffffffffffcb0;
  _iterator_hdl *in_stack_fffffffffffffcb8;
  void *in_stack_fffffffffffffcf8;
  Integer in_stack_fffffffffffffd00;
  Integer *in_stack_fffffffffffffd08;
  Integer *in_stack_fffffffffffffd10;
  void *in_stack_fffffffffffffd18;
  Integer in_stack_fffffffffffffd20;
  _iterator_hdl *in_stack_fffffffffffffd28;
  Integer in_stack_fffffffffffffd30;
  Integer in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe58;
  Integer in_stack_fffffffffffffe60;
  Integer *in_stack_fffffffffffffe68;
  Integer *in_stack_fffffffffffffe70;
  Integer *in_stack_fffffffffffffe78;
  Integer in_stack_fffffffffffffe80;
  undefined8 local_48;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar1 = _ga_sync_end;
  iVar2 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  pnga_inquire(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
  if (local_48 != 2) {
    pnga_error(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  pnga_local_iterator_init(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  while( true ) {
    iVar2 = pnga_local_iterator_next
                      (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8
                       ,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    if (iVar2 == 0) break;
    sgai_shift_diagonal_block
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               in_stack_fffffffffffffd30);
  }
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_shift_diagonal(Integer g_a, void *c)
{
  Integer loA[2], hiA[2]/*, dim1, dim2*/, ld;
  Integer andim, adims[2], type, atype;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  char *ptr;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_shift_diagonal_");

  pnga_inquire (g_a, &atype, &andim, adims);
  /*dim1 = adims[0];*/
  /*dim2 = adims[1];*/
  type = atype;
  if (andim != 2) 
    pnga_error("Dimension must be 2 for shift diagonal operation",andim);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}